

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O3

void __thiscall
cs_impl::
cni_holder<bool_(cs_impl::fiber::Channel<cs_impl::any>::*)(),_bool_(*)(cs_impl::fiber::Channel<cs_impl::any>_&)>
::cni_holder(cni_holder<bool_(cs_impl::fiber::Channel<cs_impl::any>::*)(),_bool_(*)(cs_impl::fiber::Channel<cs_impl::any>_&)>
             *this,offset_in_Channel<cs_impl::any>_to_subr *func)

{
  _Any_data local_28;
  code *local_18;
  code *pcStack_10;
  
  (this->super_cni_holder_base)._vptr_cni_holder_base = (_func_int **)&PTR__cni_holder_00330f60;
  local_18 = (code *)0x0;
  pcStack_10 = (code *)0x0;
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  if ((void *)*func != (void *)0x0) {
    local_28._8_8_ = func[1];
    pcStack_10 = std::
                 _Function_handler<bool_(cs_impl::fiber::Channel<cs_impl::any>_&),_bool_(cs_impl::fiber::Channel<cs_impl::any>::*)()>
                 ::_M_invoke;
    local_18 = std::
               _Function_handler<bool_(cs_impl::fiber::Channel<cs_impl::any>_&),_bool_(cs_impl::fiber::Channel<cs_impl::any>::*)()>
               ::_M_manager;
    local_28._M_unused._M_object = (void *)*func;
  }
  std::function<bool_(cs_impl::fiber::Channel<cs_impl::any>_&)>::function
            (&(this->mCni).mFunc,
             (function<bool_(cs_impl::fiber::Channel<cs_impl::any>_&)> *)&local_28);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return;
}

Assistant:

explicit cni_holder(const T &func) : mCni(func) {}